

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node256_leaf.cpp
# Opt level: O3

bool __thiscall duckdb::Node256Leaf::GetNextByte(Node256Leaf *this,uint8_t *byte)

{
  ulong uVar1;
  ulong uVar2;
  byte bVar3;
  bool bVar5;
  ulong uVar4;
  
  bVar3 = *byte;
  uVar4 = (ulong)bVar3;
  bVar5 = true;
  if ((this->mask[bVar3 >> 6] >> (uVar4 & 0x3f) & 1) == 0) {
    uVar2 = uVar4 - 1;
    do {
      if (uVar2 == 0xfe) {
        return false;
      }
      uVar1 = uVar2 + 2;
      uVar2 = uVar2 + 1;
      bVar3 = (char)uVar4 + 1;
      uVar4 = (ulong)bVar3;
    } while ((this->mask[uVar1 >> 6] >> (uVar1 & 0x3f) & 1) == 0);
    bVar5 = uVar2 < 0xff;
  }
  *byte = bVar3;
  return bVar5;
}

Assistant:

bool Node256Leaf::GetNextByte(uint8_t &byte) {
	ValidityMask v_mask(&mask[0], Node256::CAPACITY);
	for (uint16_t i = byte; i < CAPACITY; i++) {
		if (v_mask.RowIsValid(i)) {
			byte = UnsafeNumericCast<uint8_t>(i);
			return true;
		}
	}
	return false;
}